

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

Orientation * __thiscall
stateObservation::kine::Orientation::setToProductNoAlias
          (Orientation *this,Orientation *R1,Orientation *R2)

{
  bool bVar1;
  QuaternionBase<Eigen::Quaternion<double,0>> *this_00;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *other;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *pMVar2;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pMVar3;
  Matrix<double,_3,_3,_0,_3,_3> *local_a0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_98;
  Matrix<double,_3,_3,_0,_3,_3> *local_88;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_80;
  Matrix<double,_3,_3,_0,_3,_3> *local_70;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_68;
  Quaternion<double,_0> local_58;
  Matrix<double,_3,_3,_0,_3,_3> *local_38;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_30;
  Orientation *local_20;
  Orientation *R2_local;
  Orientation *R1_local;
  Orientation *this_local;
  
  local_20 = R2;
  R2_local = R1;
  R1_local = this;
  check_(R1);
  check_(local_20);
  bVar1 = isQuaternionSet(R2_local);
  if ((bVar1) && (bVar1 = isQuaternionSet(local_20), bVar1)) {
    bVar1 = isMatrixSet(R2_local);
    if ((bVar1) && (bVar1 = isMatrixSet(local_20), bVar1)) {
      pMVar2 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
               CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
               operator()(&R2_local->m_);
      pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
               operator()(&local_20->m_);
      local_30 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar2,pMVar3);
      pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::set
                         (&this->m_);
      local_38 = (Matrix<double,_3,_3,_0,_3,_3> *)
                 Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::noalias(pMVar3);
      Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_38,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_30);
    }
    else {
      CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::reset(&this->m_);
    }
    this_00 = (QuaternionBase<Eigen::Quaternion<double,0>> *)
              CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator()
                        (&R2_local->q_);
    other = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
            CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator()
                      (&local_20->q_);
    Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*(&local_58,this_00,other);
    CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator=
              (&this->q_,&local_58);
  }
  else {
    CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::set(&this->m_,true)
    ;
    bVar1 = isMatrixSet(R2_local);
    if (bVar1) {
      bVar1 = isMatrixSet(local_20);
      if (bVar1) {
        pMVar2 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                 CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
                 operator()(&R2_local->m_);
        pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
                 operator()(&local_20->m_);
        local_98 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar2,pMVar3);
        pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
                 operator()(&this->m_);
        local_a0 = (Matrix<double,_3,_3,_0,_3,_3> *)
                   Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::noalias(pMVar3);
        Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_a0,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                    *)&local_98);
      }
      else {
        pMVar2 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                 CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
                 operator()(&R2_local->m_);
        pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)quaternionToMatrix_(local_20);
        local_80 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar2,pMVar3);
        pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
                 operator()(&this->m_);
        local_88 = (Matrix<double,_3,_3,_0,_3,_3> *)
                   Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::noalias(pMVar3);
        Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_88,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                    *)&local_80);
      }
    }
    else {
      pMVar2 = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)quaternionToMatrix_(R2_local);
      pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
               operator()(&local_20->m_);
      local_68 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(pMVar2,pMVar3);
      pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
               operator()(&this->m_);
      local_70 = (Matrix<double,_3,_3,_0,_3,_3> *)
                 Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::noalias(pMVar3);
      Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_70,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_68);
    }
    CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::reset(&this->q_);
  }
  return this;
}

Assistant:

inline const Orientation & Orientation::setToProductNoAlias(const Orientation & R1, const Orientation & R2)
{
  R1.check_();
  R2.check_();
  if(R1.isQuaternionSet() && R2.isQuaternionSet())
  {
    if(R1.isMatrixSet() && R2.isMatrixSet())
    {
      m_.set().noalias() = R1.m_() * R2.m_();
    }
    else
    {
      m_.reset();
    }
    q_ = R1.q_() * R2.q_();
  }
  else
  {
    m_.set(true); /// we set the matrix as initialized before giving the value
    if(!R1.isMatrixSet())
    {
      m_().noalias() = R1.quaternionToMatrix_() * R2.m_();
    }
    else if(!R2.isMatrixSet())
    {
      m_().noalias() = R1.m_() * R2.quaternionToMatrix_();
    }
    else
    {
      m_().noalias() = R1.m_() * R2.m_();
    }
    q_.reset();
  }

  return *this;
}